

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

void opj_tcd_destroy(opj_tcd_t *tcd)

{
  opj_tcd_tile_t *poVar1;
  uint uVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_tilecomp_t *poVar4;
  opj_tcd_band_t *poVar5;
  code *pcVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  opj_tcd_precinct_t *poVar10;
  int iVar11;
  uint local_40;
  
  if (tcd != (opj_tcd_t *)0x0) {
    if (tcd->tcd_image != (opj_tcd_image_t *)0x0) {
      pcVar6 = opj_tcd_code_block_dec_deallocate;
      if ((tcd->field_0x3c & 1) == 0) {
        pcVar6 = opj_tcd_code_block_enc_deallocate;
      }
      poVar1 = tcd->tcd_image->tiles;
      if (poVar1 != (opj_tcd_tile_t *)0x0) {
        if (poVar1->numcomps != 0) {
          poVar4 = poVar1->comps;
          uVar9 = 0;
          do {
            poVar3 = poVar4->resolutions;
            if (poVar3 != (opj_tcd_resolution_t *)0x0) {
              if (0xbf < poVar4->resolutions_size) {
                local_40 = poVar4->resolutions_size / 0xc0;
                uVar2 = 0;
                do {
                  poVar5 = poVar3->bands;
                  iVar11 = 0;
                  do {
                    poVar10 = poVar5->precincts;
                    if (poVar10 != (opj_tcd_precinct_t *)0x0) {
                      if (0x37 < poVar5->precincts_data_size) {
                        uVar8 = (ulong)(poVar5->precincts_data_size >> 3) / 7;
                        do {
                          opj_tgt_destroy(poVar10->incltree);
                          poVar10->incltree = (opj_tgt_tree_t *)0x0;
                          opj_tgt_destroy(poVar10->imsbtree);
                          poVar10->imsbtree = (opj_tgt_tree_t *)0x0;
                          (*pcVar6)(poVar10);
                          poVar10 = poVar10 + 1;
                          uVar7 = (int)uVar8 - 1;
                          uVar8 = (ulong)uVar7;
                        } while (uVar7 != 0);
                      }
                      opj_free(poVar5->precincts);
                      poVar5->precincts = (opj_tcd_precinct_t *)0x0;
                    }
                    poVar5 = poVar5 + 1;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != 3);
                  poVar3 = poVar3 + 1;
                  uVar2 = uVar2 + 1;
                } while (uVar2 != local_40);
              }
              opj_free(poVar4->resolutions);
              poVar4->resolutions = (opj_tcd_resolution_t *)0x0;
            }
            if ((poVar4->ownsData != 0) && (poVar4->data != (OPJ_INT32 *)0x0)) {
              opj_image_data_free(poVar4->data);
              poVar4->data = (OPJ_INT32 *)0x0;
              poVar4->ownsData = 0;
              poVar4->data_size_needed = 0;
              poVar4->data_size = 0;
            }
            opj_image_data_free(poVar4->data_win);
            poVar4 = poVar4 + 1;
            uVar9 = uVar9 + 1;
          } while (uVar9 < poVar1->numcomps);
        }
        opj_free(poVar1->comps);
        poVar1->comps = (opj_tcd_tilecomp_t *)0x0;
        opj_free(tcd->tcd_image->tiles);
        tcd->tcd_image->tiles = (opj_tcd_tile_t *)0x0;
      }
    }
    if (tcd->tcd_image != (opj_tcd_image_t *)0x0) {
      opj_free(tcd->tcd_image);
      tcd->tcd_image = (opj_tcd_image_t *)0x0;
    }
    opj_free(tcd->used_component);
    opj_free(tcd);
    return;
  }
  return;
}

Assistant:

void opj_tcd_destroy(opj_tcd_t *tcd)
{
    if (tcd) {
        opj_tcd_free_tile(tcd);

        if (tcd->tcd_image) {
            opj_free(tcd->tcd_image);
            tcd->tcd_image = 00;
        }

        opj_free(tcd->used_component);

        opj_free(tcd);
    }
}